

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O2

bool CheckCollapsePath(string *path,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  string result;
  string sStack_38;
  
  cmsys::SystemTools::CollapseFullPath(&sStack_38,path);
  bVar1 = std::operator!=(expected,&sStack_38);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"CollapseFullPath(");
    poVar2 = std::operator<<(poVar2,(string *)path);
    poVar2 = std::operator<<(poVar2,")  yielded ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    poVar2 = std::operator<<(poVar2," instead of ");
    poVar2 = std::operator<<(poVar2,(string *)expected);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return !bVar1;
}

Assistant:

static bool CheckCollapsePath(
  const kwsys_stl::string& path,
  const kwsys_stl::string& expected)
{
  kwsys_stl::string result = kwsys::SystemTools::CollapseFullPath(path);
  if(expected != result)
    {
    kwsys_ios::cerr << "CollapseFullPath(" << path
      << ")  yielded " << result << " instead of " << expected << kwsys_ios::endl;
    return false;
    }
  return true;
}